

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.hpp
# Opt level: O3

bool __thiscall
vk::ValidateQueryBits::
validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceProperties>
          (ValidateQueryBits *this,VkPhysicalDevice_s *context,
          offset_in_InstanceInterface_to_subr Function,InstanceInterface *interface,
          QueryMemberTableEntry *queryMemberTableEntry)

{
  int iVar1;
  size_t __n;
  long *plVar2;
  bool bVar3;
  VkPhysicalDeviceProperties vec [2];
  undefined1 auStack_6a8 [824];
  undefined1 local_370 [832];
  
  memset(auStack_6a8,0,0x338);
  memset(local_370,0xff,0x338);
  plVar2 = (long *)((long)&interface->_vptr_InstanceInterface + Function);
  if (((ulong)context & 1) == 0) {
    (*(code *)context)(plVar2,this,auStack_6a8);
  }
  else {
    (**(code **)(context + *plVar2 + -1))(plVar2,this,auStack_6a8);
    context = *(VkPhysicalDevice_s **)(context + *plVar2 + -1);
  }
  (*(code *)context)(plVar2,this,local_370);
  __n = queryMemberTableEntry->size;
  if (__n == 0) {
    bVar3 = true;
  }
  else {
    do {
      iVar1 = bcmp(auStack_6a8 + queryMemberTableEntry->offset,
                   local_370 + queryMemberTableEntry->offset,__n);
      bVar3 = iVar1 == 0;
      if (!bVar3) {
        return bVar3;
      }
      __n = queryMemberTableEntry[1].size;
      queryMemberTableEntry = queryMemberTableEntry + 1;
    } while (__n != 0);
  }
  return bVar3;
}

Assistant:

bool validateInitComplete(Context context, void (Interface::*Function)(Context, Type*)const, const Interface& interface, const QueryMemberTableEntry* queryMemberTableEntry)
{
	const QueryMemberTableEntry	*iterator;
	Type vec[2];
	deMemset(&vec[0], 0x00, sizeof(Type));
	deMemset(&vec[1], 0xFF, sizeof(Type));

	(interface.*Function)(context, &vec[0]);
	(interface.*Function)(context, &vec[1]);

	for (iterator = queryMemberTableEntry; iterator->size != 0; iterator++)
	{
		if (deMemCmp(((deUint8*)(&vec[0]))+iterator->offset, ((deUint8*)(&vec[1]))+iterator->offset, iterator->size) != 0)
			return false;
	}

	return true;
}